

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RsCodeBlockSyntax *pRVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::SyntaxNode>(in_stack_00000070,in_stack_00000068);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsCodeBlockSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsCodeBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsCodeBlockSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}